

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O3

http_header * http_header::create(vm_val_t *lstval)

{
  vm_obj_id_t vVar1;
  ushort *puVar2;
  http_header *phVar3;
  char *__dest;
  vm_obj_id_t vVar4;
  ulong __n;
  http_header **pphVar5;
  bool bVar6;
  http_header *head;
  vm_val_t ele;
  http_header *local_60;
  vm_val_t *local_58;
  vm_val_t local_50;
  vm_val_t local_40;
  
  local_60 = (http_header *)0x0;
  local_58 = lstval;
  vVar1 = vm_val_t::ll_length(lstval);
  if ((int)vVar1 < 1) {
    local_60 = (http_header *)0x0;
  }
  else {
    pphVar5 = &local_60;
    vVar4 = 1;
    do {
      local_50.typ = VM_INT;
      local_50.val.obj = vVar4;
      vm_val_t::ll_index(local_58,&local_40,&local_50);
      puVar2 = (ushort *)vm_val_t::get_as_string(&local_40);
      if (puVar2 == (ushort *)0x0) {
        err_throw(0x7e3);
      }
      phVar3 = (http_header *)operator_new(0x18);
      __n = (ulong)*puVar2;
      phVar3->len = __n + 2;
      __dest = lib_alloc_str(__n + 2);
      phVar3->str = __dest;
      memcpy(__dest,puVar2 + 1,__n);
      phVar3->str[__n] = '\r';
      phVar3->str[__n + 1] = '\n';
      phVar3->nxt = (http_header *)0x0;
      *pphVar5 = phVar3;
      pphVar5 = &phVar3->nxt;
      bVar6 = vVar4 != vVar1;
      vVar4 = vVar4 + 1;
    } while (bVar6);
  }
  return local_60;
}

Assistant:

static http_header *create(VMG_ const vm_val_t *lstval)
    {
        /* start with an empty list */
        http_header *head = 0, **tailp = &head;
        
        /* parse the value list */
        int cnt = lstval->ll_length(vmg0_);
        for (int i = 1 ; i <= cnt ; ++i)
        {
            /* get this list element */
            vm_val_t ele;
            lstval->ll_index(vmg_ &ele, i);
            
            /* it has to be a string */
            const char *h = ele.get_as_string(vmg0_);
            if (h == 0)
                err_throw(VMERR_STRING_VAL_REQD);

            /* add a new header */
            *tailp = new http_header(h + VMB_LEN, vmb_get_len(h));
            tailp = &(*tailp)->nxt;
        }

        /* return the list head */
        return head;
    }